

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ConstantPaddingLayerParams::InternalSwap
          (ConstantPaddingLayerParams *this,ConstantPaddingLayerParams *other)

{
  ConstantPaddingLayerParams *other_local;
  ConstantPaddingLayerParams *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->padamounts_,&other->padamounts_);
  google::protobuf::internal::memswap<5>((char *)&this->value_,(char *)&other->value_);
  return;
}

Assistant:

void ConstantPaddingLayerParams::InternalSwap(ConstantPaddingLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  padamounts_.InternalSwap(&other->padamounts_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(ConstantPaddingLayerParams, padtogivenoutputsizemode_)
      + sizeof(ConstantPaddingLayerParams::padtogivenoutputsizemode_)
      - PROTOBUF_FIELD_OFFSET(ConstantPaddingLayerParams, value_)>(
          reinterpret_cast<char*>(&value_),
          reinterpret_cast<char*>(&other->value_));
}